

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O0

size_t cache_getused(void)

{
  uint uVar1;
  ulong uStack_18;
  uint32_t s;
  size_t i;
  size_t result;
  
  i = 0;
  for (uStack_18 = 0; uStack_18 < cache_size; uStack_18 = uStack_18 + 1) {
    uVar1 = cache_status[uStack_18];
    if ((uVar1 & 0x80000000) != 0) {
      fprintf(_stderr,"cache_getuser: cache in use during cache_getused()\n");
    }
    if (uVar1 != 0) {
      i = i + 1;
    }
  }
  return i;
}

Assistant:

size_t
cache_getused()
{
    size_t result = 0;
    for (size_t i=0;i<cache_size;i++) {
        uint32_t s = cache_status[i];
        if (s & 0x80000000) fprintf(stderr, "cache_getuser: cache in use during cache_getused()\n");
        if (s) result++;
    }
    return result;
}